

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

InterpretResult __thiscall VM::run(VM *this)

{
  uint uVar1;
  uchar uVar2;
  byte bVar3;
  long lVar4;
  pointer pbVar5;
  _Alloc_hider _Var6;
  value_type *__val;
  Instructions *pIVar7;
  mapped_type *pmVar8;
  iterator iVar9;
  iterator iVar10;
  long *plVar11;
  undefined8 uVar12;
  uint uVar13;
  long *plVar14;
  pointer puVar15;
  int iVar16;
  ulong uVar17;
  char *pcVar18;
  int iVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  string error;
  key_type local_a0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  pIVar7 = this->instructions;
  uVar13 = this->ip;
  uVar17 = (ulong)(int)uVar13;
  puVar15 = (pIVar7->code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start;
  if (uVar17 < (ulong)((long)(pIVar7->code).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar15)) {
    local_80 = &(this->tapes)._M_h;
    do {
      paVar20 = &local_a0.field_2;
      uVar1 = uVar13 + 1;
      this->ip = uVar1;
      local_a0._M_dataplus._M_p = (pointer)paVar20;
      switch(puVar15[uVar17]) {
      case '\0':
        this->ip = uVar13 + 2;
        pbVar5 = (pIVar7->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = (pIVar7->code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start[(int)uVar1];
        _Var6._M_p = pbVar5[bVar3]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,_Var6._M_p,_Var6._M_p + pbVar5[bVar3]._M_string_length);
        iVar9 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(local_80,&local_a0);
        if (iVar9.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
            ._M_cur == (__node_type *)0x0) {
LAB_0010677d:
          std::__throw_out_of_range("_Map_base::at");
LAB_00106789:
          std::__throw_out_of_range("_Map_base::at");
LAB_00106795:
          uVar12 = std::__throw_out_of_range("_Map_base::at");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,
                            (ulong)(local_78.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          _Unwind_Resume(uVar12);
        }
        *(long *)((long)iVar9.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                        ._M_cur + 0x40) =
             *(long *)((long)iVar9.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                             ._M_cur + 0x40) + 1;
        goto LAB_00106433;
      case '\x01':
        this->ip = uVar13 + 2;
        pbVar5 = (pIVar7->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = (pIVar7->code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start[(int)uVar1];
        _Var6._M_p = pbVar5[bVar3]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,_Var6._M_p,_Var6._M_p + pbVar5[bVar3]._M_string_length);
        iVar9 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(local_80,&local_a0);
        if (iVar9.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
            ._M_cur == (__node_type *)0x0) {
LAB_00106765:
          std::__throw_out_of_range("_Map_base::at");
LAB_00106771:
          std::__throw_out_of_range("_Map_base::at");
          goto LAB_0010677d;
        }
        lVar4 = *(long *)((long)iVar9.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                ._M_cur + 0x40);
        if (lVar4 == 0) {
          std::operator+(&local_78,"Attempting to decrement the pointer below 0 on ",&local_a0);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_78);
          local_50 = (long *)*plVar11;
          plVar14 = plVar11 + 2;
          if (local_50 == plVar14) {
            local_40 = *plVar14;
            lStack_38 = plVar11[3];
            local_50 = &local_40;
          }
          else {
            local_40 = *plVar14;
          }
          local_48 = plVar11[1];
          *plVar11 = (long)plVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,
                            (ulong)(local_78.field_2._M_allocated_capacity + 1));
          }
          runtimeError(this,(char *)local_50);
          run();
        }
        else {
          *(long *)((long)iVar9.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                          ._M_cur + 0x40) = lVar4 + -1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar20) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if (lVar4 == 0) {
          return RUNTIME_ERROR;
        }
        break;
      case '\x02':
        this->ip = uVar13 + 2;
        pbVar5 = (pIVar7->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = (pIVar7->code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start[(int)uVar1];
        _Var6._M_p = pbVar5[bVar3]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,_Var6._M_p,_Var6._M_p + pbVar5[bVar3]._M_string_length);
        iVar9 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(local_80,&local_a0);
        if (iVar9.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
            ._M_cur == (__node_type *)0x0) goto LAB_00106771;
        pcVar18 = (char *)(*(long *)((long)iVar9.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                           ._M_cur + 0x28) +
                          *(long *)((long)iVar9.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                          ._M_cur + 0x40));
        *pcVar18 = *pcVar18 + '\x01';
        goto LAB_00106433;
      case '\x03':
        this->ip = uVar13 + 2;
        pbVar5 = (pIVar7->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = (pIVar7->code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start[(int)uVar1];
        _Var6._M_p = pbVar5[bVar3]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,_Var6._M_p,_Var6._M_p + pbVar5[bVar3]._M_string_length);
        iVar9 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(local_80,&local_a0);
        if (iVar9.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
            ._M_cur == (__node_type *)0x0) {
LAB_00106759:
          std::__throw_out_of_range("_Map_base::at");
          goto LAB_00106765;
        }
        pcVar18 = (char *)(*(long *)((long)iVar9.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                           ._M_cur + 0x28) +
                          *(long *)((long)iVar9.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                          ._M_cur + 0x40));
        *pcVar18 = *pcVar18 + -1;
        goto LAB_00106433;
      case '\x04':
        this->ip = uVar13 + 2;
        pbVar5 = (pIVar7->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = (pIVar7->code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start[(int)uVar1];
        _Var6._M_p = pbVar5[bVar3]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,_Var6._M_p,_Var6._M_p + pbVar5[bVar3]._M_string_length);
        iVar9 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(local_80,&local_a0);
        if (iVar9.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
            ._M_cur == (__node_type *)0x0) {
LAB_0010674d:
          std::__throw_out_of_range("_Map_base::at");
          goto LAB_00106759;
        }
        local_78._M_dataplus._M_p._0_1_ =
             *(undefined1 *)
              (*(long *)((long)iVar9.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                               ._M_cur + 0x28) +
              *(long *)((long)iVar9.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                              ._M_cur + 0x40));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&local_78,1);
        goto LAB_00106433;
      case '\x05':
        this->ip = uVar13 + 2;
        pbVar5 = (pIVar7->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = (pIVar7->code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start[(int)uVar1];
        _Var6._M_p = pbVar5[bVar3]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,_Var6._M_p,_Var6._M_p + pbVar5[bVar3]._M_string_length);
        iVar9 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(local_80,&local_a0);
        if (iVar9.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
            ._M_cur == (__node_type *)0x0) {
LAB_00106741:
          std::__throw_out_of_range("_Map_base::at");
          goto LAB_0010674d;
        }
        iVar16 = getchar();
        *(char *)(*(long *)((long)iVar9.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                  ._M_cur + 0x28) +
                 *(long *)((long)iVar9.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                 ._M_cur + 0x40)) = (char)iVar16;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar20) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        break;
      case '\x06':
        this->ip = uVar13 + 2;
        pbVar5 = (pIVar7->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = (pIVar7->code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start[(int)uVar1];
        _Var6._M_p = pbVar5[bVar3]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,_Var6._M_p,_Var6._M_p + pbVar5[bVar3]._M_string_length);
        iVar9 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(local_80,&local_a0);
        if (iVar9.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
          goto LAB_00106741;
        }
        uVar13 = this->ip;
        this->ip = uVar13 + 1;
        puVar15 = (this->instructions->code).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar2 = puVar15[(int)uVar13];
        this->ip = uVar13 + 2;
        if (*(char *)(*(long *)((long)iVar9.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                      ._M_cur + 0x28) +
                     *(long *)((long)iVar9.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                     ._M_cur + 0x40)) == '\0') {
          this->ip = (uint)CONCAT11(uVar2,puVar15[(int)(uVar13 + 1)]) + uVar13 + 2;
        }
LAB_00106433:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar20) {
LAB_00106609:
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        break;
      case '\a':
        this->ip = uVar13 + 3;
        uVar2 = puVar15[(int)(uVar13 + 2)];
        this->ip = uVar13 + 4;
        this->ip = (uVar13 - CONCAT11(uVar2,puVar15[(int)(uVar13 + 3)])) + 4;
        break;
      case '\b':
        this->ip = uVar13 + 2;
        pbVar5 = (pIVar7->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = (pIVar7->code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start[(int)uVar1];
        _Var6._M_p = pbVar5[bVar3]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,_Var6._M_p,_Var6._M_p + pbVar5[bVar3]._M_string_length);
        local_78._M_dataplus._M_p = (pointer)0x0;
        local_78._M_string_length = 0;
        local_78.field_2._M_allocated_capacity = 0;
        local_78._M_dataplus._M_p = (pointer)operator_new(30000);
        pcVar18 = local_78._M_dataplus._M_p + 30000;
        local_78._M_string_length = (size_type)local_78._M_dataplus._M_p;
        local_78.field_2._M_allocated_capacity = (size_type)pcVar18;
        memset(local_78._M_dataplus._M_p,0,30000);
        local_78.field_2._8_8_ = 0;
        local_78._M_string_length = (size_type)pcVar18;
        pmVar8 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_80,&local_a0);
        goto LAB_001065c8;
      case '\t':
        this->ip = uVar13 + 2;
        pbVar5 = (pIVar7->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = (pIVar7->code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start[(int)uVar1];
        _Var6._M_p = pbVar5[bVar3]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,_Var6._M_p,_Var6._M_p + pbVar5[bVar3]._M_string_length);
        local_78._M_dataplus._M_p = (pointer)0x0;
        local_78._M_string_length = 0;
        local_78.field_2._M_allocated_capacity = 0;
        local_78._M_dataplus._M_p = (pointer)operator_new(30000);
        pcVar18 = local_78._M_dataplus._M_p + 30000;
        local_78._M_string_length = (size_type)local_78._M_dataplus._M_p;
        local_78.field_2._M_allocated_capacity = (size_type)pcVar18;
        memset(local_78._M_dataplus._M_p,0,30000);
        local_78.field_2._8_8_ = 0;
        local_78._M_string_length = (size_type)pcVar18;
        pmVar8 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_80,&local_a0);
LAB_001065c8:
        std::vector<char,_std::allocator<char>_>::_M_move_assign(&pmVar8->values,&local_78);
        pmVar8->ptr = local_78.field_2._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_78._M_dataplus._M_p,
                          local_78.field_2._M_allocated_capacity - (long)local_78._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p == paVar20) break;
        goto LAB_00106609;
      case '\n':
        this->ip = uVar13 + 2;
        pbVar5 = (pIVar7->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = (pIVar7->code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start[(int)uVar1];
        _Var6._M_p = pbVar5[bVar3]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,_Var6._M_p,_Var6._M_p + pbVar5[bVar3]._M_string_length);
        iVar9 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(local_80,&local_a0);
        if (iVar9.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
            ._M_cur == (__node_type *)0x0) goto LAB_00106789;
        iVar16 = (int)*(char *)(*(long *)((long)iVar9.
                                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                                ._M_cur + 0x28) +
                               *(long *)((long)iVar9.
                                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                               ._M_cur + 0x40));
        pbVar5 = (this->instructions->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar19 = (int)((ulong)((long)(this->instructions->names).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5) >> 5
                      );
        if (iVar16 < iVar19) {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          _Var6._M_p = pbVar5[iVar16]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_78,_Var6._M_p,_Var6._M_p + pbVar5[iVar16]._M_string_length);
          iVar10 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(local_80,&local_78);
          if (iVar10.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
              ._M_cur == (__node_type *)0x0) goto LAB_00106795;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,
                            (ulong)(local_78.field_2._M_allocated_capacity + 1));
          }
          *(undefined1 *)
           (*(long *)((long)iVar9.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                            ._M_cur + 0x28) +
           *(long *)((long)iVar9.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                           ._M_cur + 0x40)) =
               *(undefined1 *)
                (*(long *)((long)iVar10.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                 ._M_cur + 0x28) +
                *(long *)((long)iVar10.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                ._M_cur + 0x40));
        }
        else {
          runtimeError(this,"Attempting to copy a value from a tape that does not exist.");
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if (iVar19 <= iVar16) {
          return RUNTIME_ERROR;
        }
      }
      pIVar7 = this->instructions;
      uVar13 = this->ip;
      uVar17 = (ulong)(int)uVar13;
      puVar15 = (pIVar7->code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar17 < (ulong)((long)(pIVar7->code).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar15));
  }
  return OK;
}

Assistant:

InterpretResult VM::run()
{
    auto readByte = [this]() -> uint8_t
    {
        return this->instructions.getCodeAt(this->ip++);
    };

    while (instructions.hasCodeAt(ip))
    {
#ifdef DEBUG_TRACE_EXECUTION
        instructions.disassembleInstruction(ip);
#endif

        auto instruction = OpCode(readByte());
        switch (instruction)
        {
            case OpCode::BEGIN:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                
                uint16_t offset = (readByte() << 8) | readByte();
                if (tape.values[tape.ptr] == 0) ip += offset;

                break;
            }
            case OpCode::DECATPTR:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                tape.values[tape.ptr] = tape.values[tape.ptr] - 1;

                break;
            }
            case OpCode::DECPTR:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                if (tape.ptr == 0)
                {
                    std::string error = "Attempting to decrement the pointer below 0 on " + name + ".";
                    runtimeError(error.c_str());
                    return InterpretResult::RUNTIME_ERROR;
                }
                else
                {
                    tape.ptr--;
                }
                break;
            }
            case OpCode::DEFINE_NAME:
            {
                const auto& name = instructions.getNameAt(readByte());
                tapes[name] = Tape();
                break;
            }
            case OpCode::DELETE_NAME:
            {
                // Should actually erase the tape or something here.
                const auto& name = instructions.getNameAt(readByte());
                tapes[name] = Tape();
                break;
            }
            case OpCode::END:
            {
                readByte(); // Tape name, not required here.
                uint16_t offset = (readByte() << 8) | readByte();
                ip -= offset;
                break;
            }
            case OpCode::INCATPTR:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                tape.values[tape.ptr] = tape.values[tape.ptr] + 1;

                break;
            }
            case OpCode::INCPTR:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                tape.ptr++;
                break;
            }
            case OpCode::INPUT:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                tape.values[tape.ptr] = getchar();
                break;
            }
            case OpCode::OUTPUT:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                std::cout << tape.values[tape.ptr];
                break;
            }
            case OpCode::COPY_FROM:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                auto fromIdx = tape.values[tape.ptr];
                if (fromIdx >= instructions.tapeCount())
                {
                    runtimeError("Attempting to copy a value from a tape that does not exist.");
                    return InterpretResult::RUNTIME_ERROR;
                }
                else
                {
                    auto& fromTape = tapes.at(instructions.getNameAt(fromIdx));
                    tape.values[tape.ptr] = fromTape.values[fromTape.ptr];
                }
                break;
            }
        }
    }
    return InterpretResult::OK;
}